

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Image * __thiscall
pbrt::Image::ConvertToFormat
          (Image *__return_storage_ptr__,Image *this,PixelFormat newFormat,
          ColorEncodingHandle *encoding)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Tuple2<pbrt::Point2,_int> resolution;
  int iVar2;
  Allocator alloc;
  size_t sVar3;
  long lVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  Point2i p;
  ulong uVar7;
  Float value;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  
  if (this->format == newFormat) {
    Image(__return_storage_ptr__,this);
  }
  else {
    pbVar1 = (this->channelNames).ptr;
    local_38.bits =
         (encoding->
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         ).bits;
    resolution = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
    sVar3 = (this->channelNames).nStored;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->channelNames).field_2;
    if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar6 = pbVar1;
    }
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    channels.n = sVar3;
    channels.ptr = pbVar6;
    Image(__return_storage_ptr__,newFormat,(Point2i)resolution,channels,
          (ColorEncodingHandle *)&local_38,alloc);
    iVar5 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
    if (0 < iVar5) {
      lVar4 = 0;
      do {
        iVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
        if (0 < iVar2) {
          sVar3 = (this->channelNames).nStored;
          uVar7 = 0;
          do {
            if (0 < (int)sVar3) {
              iVar5 = 0;
              p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar4 << 0x20 | uVar7)
              ;
              do {
                value = GetChannel(this,p,iVar5,(WrapMode2D)0x200000002);
                SetChannel(__return_storage_ptr__,p,iVar5,value);
                sVar3 = (this->channelNames).nStored;
                iVar5 = iVar5 + 1;
              } while (iVar5 < (int)sVar3);
              iVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
            }
            uVar7 = uVar7 + 1;
          } while ((long)uVar7 < (long)iVar2);
          iVar5 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image Image::ConvertToFormat(PixelFormat newFormat, ColorEncodingHandle encoding) const {
    if (newFormat == format)
        return *this;

    Image newImage(newFormat, resolution, channelNames, encoding);
    for (int y = 0; y < resolution.y; ++y)
        for (int x = 0; x < resolution.x; ++x)
            for (int c = 0; c < NChannels(); ++c)
                newImage.SetChannel({x, y}, c, GetChannel({x, y}, c));
    return newImage;
}